

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisReadDisplacement(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 size)

{
  ZyanStatus ZVar1;
  ZyanI64 ZStack_40;
  ZyanStatus status_047620348_3;
  ZyanU64 value_3;
  ZyanStatus status_047620348_2;
  ZyanU32 value_2;
  ZyanStatus status_047620348_1;
  ZyanU16 value_1;
  ZyanStatus status_047620348;
  ZyanU8 value;
  ZyanU8 size_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  value_1._1_1_ = size;
  _status_047620348 = instruction;
  instruction_local = (ZydisDecodedInstruction *)state;
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2d9,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2da,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  if ((instruction->raw).disp.size != '\0') {
    __assert_fail("instruction->raw.disp.size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2db,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  (instruction->raw).disp.size = size;
  (instruction->raw).disp.offset = instruction->length;
  if (size == '\b') {
    ZVar1 = ZydisInputNext(state,instruction,(ZyanU8 *)&value_1);
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    (_status_047620348->raw).disp.value = (long)(char)value_1;
  }
  else if (size == '\x10') {
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)((long)&value_2 + 2),'\x02');
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    (_status_047620348->raw).disp.value = (long)value_2._2_2_;
  }
  else if (size == ' ') {
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)((long)&value_3 + 4),'\x04');
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    (_status_047620348->raw).disp.value = (long)value_3._4_4_;
  }
  else {
    if (size != '@') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x2ff,
                    "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                   );
    }
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&stack0xffffffffffffffc0,'\b');
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    (_status_047620348->raw).disp.value = ZStack_40;
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisReadDisplacement(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 size)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(instruction->raw.disp.size == 0);

    instruction->raw.disp.size = size;
    instruction->raw.disp.offset = instruction->length;

    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        instruction->raw.disp.value = *(ZyanI8*)&value;
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        instruction->raw.disp.value = *(ZyanI16*)&value;
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        instruction->raw.disp.value = *(ZyanI32*)&value;
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        instruction->raw.disp.value = *(ZyanI64*)&value;
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}